

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool square_reveal_trap(chunk *c,loc grid,_Bool always,_Bool domsg)

{
  bitflag *flags;
  _Bool _Var1;
  trap *ptVar2;
  _Bool _Var3;
  int local_4c;
  
  ptVar2 = square_trap((chunk_conflict *)c,grid);
  _Var1 = square_isplayertrap((chunk_conflict *)c,grid);
  _Var3 = false;
  if (_Var1) {
    local_4c = 0;
    for (; ptVar2 != (trap *)0x0; ptVar2 = ptVar2->next) {
      flags = ptVar2->flags;
      _Var1 = flag_has_dbg(flags,3,2,"trap->flags","TRF_TRAP");
      if ((_Var1) && ((always || ((int)(uint)ptVar2->power <= (player->state).skills[4])))) {
        _Var1 = flag_has_dbg(flags,3,3,"trap->flags","TRF_VISIBLE");
        if (!_Var1) {
          flag_on_dbg(flags,3,3,"trap->flags","TRF_VISIBLE");
          square_memorize_traps(c,grid);
          local_4c = local_4c + 1;
        }
      }
    }
    if (local_4c == 0) {
      _Var3 = false;
    }
    else {
      if (domsg) {
        if (local_4c == 1) {
          msg("You have found a trap.");
        }
        else {
          msg("You have found %d traps.");
        }
      }
      square_memorize((chunk_conflict *)c,grid);
      square_light_spot(c,grid);
      _Var3 = true;
    }
  }
  return _Var3;
}

Assistant:

bool square_reveal_trap(struct chunk *c, struct loc grid, bool always,
						bool domsg)
{
    int found_trap = 0;
	struct trap *trap = square_trap(c, grid);
    
    /* Check there is a player trap */
    if (!square_isplayertrap(c, grid))
		return false;

	/* Scan the grid */
	while (trap) {
		/* Skip non-player traps */
		if (!trf_has(trap->flags, TRF_TRAP)) {
			trap = trap->next;
			continue;
		}
		
		/* Skip traps the player doesn't notice */
		if (!always && player->state.skills[SKILL_SEARCH] < trap->power) {
			trap = trap->next;
			continue;
		}

		/* Trap is invisible */
		if (!trf_has(trap->flags, TRF_VISIBLE)) {
			/* See the trap (actually, see all the traps) */
			trf_on(trap->flags, TRF_VISIBLE);
			square_memorize_traps(c, grid);

			/* We found a trap */
			found_trap++;
		}
		trap = trap->next;
	}

    /* We found at least one trap */
    if (found_trap) {
		/* We want to talk about it */
		if (domsg) {
			if (found_trap == 1)
				msg("You have found a trap.");
			else
				msg("You have found %d traps.", found_trap);
		}

		/* Memorize */
		square_memorize(c, grid);

		/* Redraw */
		square_light_spot(c, grid);
    }

    /* Return true if we found any traps */
    return (found_trap != 0);
}